

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:34:25)>
  functions;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:35:25)>
  functions_1;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:65:25)>
  functions_00;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:101:23)>
  functions_01;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:36:25)>
  functions_2;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:66:25)>
  functions_1_00;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:102:23)>
  functions_1_01;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:67:25)>
  functions_2_00;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:103:23)>
  functions_2_01;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:68:25)>
  functions_3;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:104:23)>
  functions_3_00;
  int iVar2;
  int iVar3;
  _Setprecision _Var4;
  ostream *poVar5;
  long lVar6;
  anon_class_24_3_162b14be_for_func *in_RCX;
  anon_class_16_2_20c3992a_for_func *t_00;
  anon_class_16_2_20c3992a_for_func *t_01;
  double scanfd;
  int t_1;
  char *str_doubles;
  int scanfres;
  int t;
  char *pos;
  unsigned_long separation;
  char *str_ints;
  int value;
  int *__end1;
  int *__begin1;
  int (*__range1) [9];
  char cstr [16];
  char str [16];
  char *hint;
  int ints [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb00;
  char **in_stack_fffffffffffffb08;
  vector<time_result,_std::allocator<time_result>_> *pvVar7;
  char **in_stack_fffffffffffffb48;
  char *in_stack_fffffffffffffb58;
  undefined8 in_stack_fffffffffffffb60;
  double local_3d8;
  undefined1 *local_3d0;
  char **local_3c8;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:104:23)>
  local_3c0;
  undefined1 *local_3a8;
  char **local_3a0;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:103:23)>
  local_398;
  undefined1 *local_380;
  char **local_378;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:102:23)>
  local_370;
  undefined1 *local_358;
  char **local_350;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:101:23)>
  local_348;
  undefined1 local_329 [33];
  string local_308 [60];
  int local_2cc;
  char *local_2c8;
  int local_2bc;
  undefined1 *local_2b8;
  char **local_2b0;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:68:25)>
  local_2a8;
  undefined1 *local_290;
  char **local_288;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:67:25)>
  local_280;
  undefined1 *local_268;
  char **local_260;
  vector<time_result,_std::allocator<time_result>_> *local_258;
  string *in_stack_fffffffffffffdb8;
  long in_stack_fffffffffffffdc0;
  anon_class_1_0_00000001 *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_228;
  char **in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  long in_stack_fffffffffffffdf0;
  anon_class_1_0_00000001 *in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffe00 [16];
  char **in_stack_fffffffffffffe10;
  anon_class_16_2_20c3992a_for_func in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe28 [16];
  char **in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe40 [12];
  char *pcVar8;
  char **ppcVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  char **in_stack_fffffffffffffe68;
  uint *local_178;
  char *local_170;
  char **local_168;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:36:25)>
  local_160;
  uint *local_140;
  char **local_138;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:35:25)>
  local_130;
  char *local_118;
  uint *local_110;
  char **local_108;
  func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:34:25)>
  local_100;
  string local_d0 [32];
  anon_class_24_3_162b14be_for_func local_b0 [2];
  uint local_74;
  uint *local_70;
  uint *local_68;
  uint *local_60;
  char local_58 [16];
  char local_48 [24];
  char *local_30;
  uint local_28 [9];
  uint local_4;
  
  local_4 = 0;
  poVar5 = std::operator<<((ostream *)&std::cout,"Hello, World!");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  memcpy(local_28,&DAT_001104b0,0x24);
  local_30 = 
  "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
  ;
  memset(local_48,0,0x10);
  memset(local_58,0,0x10);
  local_70 = &local_4;
  local_68 = local_28;
  local_60 = local_68;
  for (; local_68 != local_70; local_68 = local_68 + 1) {
    local_74 = *local_68;
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
    local_118 = local_48;
    local_110 = &local_74;
    local_108 = &local_30;
    bench::func<main::__0>(&local_100,(bench *)"sprintf",(char *)&local_118,in_RCX);
    local_140 = &local_74;
    local_138 = &local_30;
    bench::func<main::__1>
              (&local_130,(bench *)"to_str",(char *)&local_140,
               (anon_class_16_2_073ce1ed_for_func *)in_RCX);
    local_178 = &local_74;
    local_170 = local_58;
    local_168 = &local_30;
    bench::func<main::__2>
              (&local_160,(bench *)"konvert",(char *)&local_178,
               (anon_class_24_3_9e904ed3_for_func *)in_RCX);
    in_RCX = local_b0;
    functions.func.str = (char (*) [16])in_stack_fffffffffffffde8;
    functions.desc = (char *)in_stack_fffffffffffffde0;
    functions.func.value = (int *)in_stack_fffffffffffffdf0;
    functions.func.hint = (char **)in_stack_fffffffffffffdf8;
    functions_1.func.hint = in_stack_fffffffffffffe10;
    functions_1.desc = (char *)in_stack_fffffffffffffe00._0_8_;
    functions_1.func.value = (int *)in_stack_fffffffffffffe00._8_8_;
    functions_2.func.cstr = (char (*) [16])in_stack_fffffffffffffe28._0_8_;
    functions_2.func.hint = (char **)in_stack_fffffffffffffe28._8_8_;
    functions_2.desc = (char *)in_stack_fffffffffffffe18.pos;
    functions_2.func.value = (int *)in_stack_fffffffffffffe18.hint;
    in_stack_fffffffffffffb00 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100.func.str;
    in_stack_fffffffffffffb08 = (char **)local_100.func.value;
    pvVar7 = (vector<time_result,_std::allocator<time_result>_> *)local_100.func.hint;
    in_stack_fffffffffffffb48 = local_160.func.hint;
    bench::$_0::operator()
              (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               functions,functions_1,functions_2);
    std::vector<time_result,_std::allocator<time_result>_>::~vector(pvVar7);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string(local_d0);
    poVar5 = std::operator<<((ostream *)&std::cout,"konvert   : ");
    iVar2 = konvert::itoa((int)((ulong)in_stack_fffffffffffffb60 >> 0x20),in_stack_fffffffffffffb58)
    ;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5," = \"");
    poVar5 = std::operator<<(poVar5,local_58);
    poVar5 = std::operator<<(poVar5,"\"\n");
    poVar5 = std::operator<<(poVar5,"sprintf   : ");
    iVar2 = sprintf(local_48,"%d",(ulong)local_74);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5," = \"");
    poVar5 = std::operator<<(poVar5,local_48);
    poVar5 = std::operator<<(poVar5,"\"\n");
    poVar5 = std::operator<<(poVar5,"to_string : \"");
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
    poVar5 = std::operator<<(poVar5,(string *)&stack0xfffffffffffffe68);
    std::operator<<(poVar5,"\"\n");
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
  }
  pcVar12 = 
  "42            -1            666666666666  -666          -23489535     0             1028455535    -502345535    202345535     1232348935    450234535     9999999999999 026026        4             502348965     "
  ;
  pcVar8 = 
  "42            -1            666666666666  -666          -23489535     0             1028455535    -502345535    202345535     1232348935    450234535     9999999999999 026026        4             502348965     "
  ;
  uVar10 = 0xe;
  for (iVar2 = 0; iVar2 < 0xf; iVar2 = iVar2 + 1) {
    t_00 = (anon_class_16_2_20c3992a_for_func *)&stack0xfffffffffffffdef;
    ppcVar9 = (char **)pcVar8;
    uVar11 = uVar10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffdf0,pcVar8,uVar10,(allocator *)t_00)
    ;
    std::operator+((char *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
    bench::func<main::__3>
              ((func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:65:25)>
                *)&stack0xfffffffffffffdd0,(bench *)"konvert",&stack0xfffffffffffffdc0,t_00);
    local_268 = &stack0xfffffffffffffe50;
    local_260 = &local_30;
    bench::func<main::__4>
              ((func_holder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kkon[P]konvert_bench_main_cpp:66:25)>
                *)&local_258,(bench *)"atoi",(char *)&local_268,
               (anon_class_16_2_20c3992a_for_func *)t_00);
    local_290 = &stack0xfffffffffffffe50;
    local_288 = &local_30;
    bench::func<main::__5>
              (&local_280,(bench *)"strtol",(char *)&local_290,
               (anon_class_16_2_20c3992a_for_func *)t_00);
    local_2b8 = &stack0xfffffffffffffe50;
    local_2b0 = &local_30;
    in_stack_fffffffffffffb08 = in_stack_fffffffffffffde0;
    bench::func<main::__6>
              (&local_2a8,(bench *)"scanf",(char *)&local_2b8,
               (anon_class_16_2_20c3992a_for_func *)t_00);
    functions_00.func = in_stack_fffffffffffffe18;
    functions_00.desc = (char *)in_stack_fffffffffffffe10;
    functions_1_00.func.hint = in_stack_fffffffffffffe38;
    functions_1_00.desc = (char *)in_stack_fffffffffffffe28._0_8_;
    functions_1_00.func.pos = (char **)in_stack_fffffffffffffe28._8_8_;
    functions_2_00.func.pos._4_4_ = iVar2;
    functions_2_00._0_12_ = in_stack_fffffffffffffe40;
    functions_2_00.func.hint = ppcVar9;
    functions_3.func.pos = (char **)pcVar12;
    functions_3.desc = (char *)uVar11;
    functions_3.func.hint = in_stack_fffffffffffffe68;
    in_stack_fffffffffffffb00 = pbStack_228;
    pvVar7 = local_258;
    in_stack_fffffffffffffde0 = in_stack_fffffffffffffb08;
    bench::$_0::operator()
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               functions_00,functions_1_00,functions_2_00,functions_3);
    std::vector<time_result,_std::allocator<time_result>_>::~vector(pvVar7);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdef);
    __isoc99_sscanf(ppcVar9,"%d",&local_2bc);
    poVar5 = std::operator<<((ostream *)&std::cout,"konvert   : ");
    iVar3 = konvert::atoi((char *)ppcVar9);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"konvert_l : ");
    lVar6 = konvert::atol((char *)ppcVar9);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,lVar6);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"atoi      : ");
    iVar3 = atoi((char *)ppcVar9);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"strtol    : ");
    lVar6 = strtol((char *)ppcVar9,(char **)0x0,10);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,lVar6);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"sscanf    : ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_2bc);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar8 = (char *)(uVar11 + (long)ppcVar9);
    uVar10 = uVar11;
  }
  local_2c8 = 
  "42.4242       -1.           -66666.666666 42            -2348953.3345 59489.5535    10.28455535   -5023.45535   20.2345535    12323489.3343 45023.4535    99.9999999999 026026.000056 40.           50234896.3345 "
  ;
  pcVar8 = 
  "42.4242       -1.           -66666.666666 42            -2348953.3345 59489.5535    10.28455535   -5023.45535   20.2345535    12323489.3343 45023.4535    99.9999999999 026026.000056 40.           50234896.3345 "
  ;
  for (local_2cc = 0; local_2cc < 0xf; local_2cc = local_2cc + 1) {
    t_01 = (anon_class_16_2_20c3992a_for_func *)local_329;
    ppcVar9 = (char **)pcVar8;
    uVar11 = uVar10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_329 + 1),pcVar8,uVar10,(allocator *)t_01);
    std::operator+((char *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
    local_358 = &stack0xfffffffffffffe50;
    local_350 = &local_30;
    bench::func<main::__7>(&local_348,(bench *)"konvert",(char *)&local_358,t_01);
    local_380 = &stack0xfffffffffffffe50;
    local_378 = &local_30;
    bench::func<main::__8>
              (&local_370,(bench *)"atof",(char *)&local_380,
               (anon_class_16_2_20c3992a_for_func *)t_01);
    local_3a8 = &stack0xfffffffffffffe50;
    local_3a0 = &local_30;
    bench::func<main::__9>
              (&local_398,(bench *)"strtod",(char *)&local_3a8,
               (anon_class_16_2_20c3992a_for_func *)t_01);
    local_3d0 = &stack0xfffffffffffffe50;
    local_3c8 = &local_30;
    bench::func<main::__10>
              (&local_3c0,(bench *)"scanf",(char *)&local_3d0,
               (anon_class_16_2_20c3992a_for_func *)t_01);
    functions_01.func.pos = in_stack_fffffffffffffe18.pos;
    functions_01.func.hint = in_stack_fffffffffffffe18.hint;
    functions_01.desc = (char *)in_stack_fffffffffffffe10;
    functions_1_01.func.hint = in_stack_fffffffffffffe38;
    functions_1_01.desc = (char *)in_stack_fffffffffffffe28._0_8_;
    functions_1_01.func.pos = (char **)in_stack_fffffffffffffe28._8_8_;
    functions_2_01.func.pos._4_4_ = iVar2;
    functions_2_01._0_12_ = in_stack_fffffffffffffe40;
    functions_2_01.func.hint = ppcVar9;
    functions_3_00.func.pos = (char **)pcVar12;
    functions_3_00.desc = (char *)uVar11;
    functions_3_00.func.hint = in_stack_fffffffffffffe68;
    in_stack_fffffffffffffb00 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348.func.pos;
    in_stack_fffffffffffffb08 = local_348.func.hint;
    pvVar7 = (vector<time_result,_std::allocator<time_result>_> *)local_370.desc;
    bench::$_0::operator()
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               functions_01,functions_1_01,functions_2_01,functions_3_00);
    std::vector<time_result,_std::allocator<time_result>_>::~vector(pvVar7);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string((string *)(local_329 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_329);
    __isoc99_sscanf(ppcVar9,"%lf",&local_3d8);
    _Var4 = std::setprecision(0x10);
    poVar5 = std::operator<<((ostream *)&std::cout,_Var4);
    poVar5 = std::operator<<(poVar5,"konvert : ");
    dVar1 = konvert::atof((char *)ppcVar9);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"atof    : ");
    dVar1 = atof((char *)ppcVar9);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"strtod  : ");
    dVar1 = strtod((char *)ppcVar9,(char **)0x0);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"sscanf  : ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_3d8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar8 = (char *)(uVar11 + (long)ppcVar9);
    uVar10 = uVar11;
  }
  return local_4;
}

Assistant:

int main() {

  std::cout << "Hello, World!" << std::endl;

  /**
   * Benchmark int to string conversion
   */

  int ints[] = { 42, -1, 1600066666, -666, 0, -502345535, 26026, 4, 1999999990 };

  const char *hint =
    "you should not see this output because (==43) is never true, "
    "it's just used to avoid compiler optimisation in the benchmark\n";

  char str[16]  = "";
  char cstr[16] = "";

  for(auto const value: ints){

    time_compare(
      1000000u, "int -> string: " +  std::to_string(value),

      func("sprintf",   [&]{ if( sprintf(str, "%d", value) == 43      ) printf("%s\n",hint); }),
      func("to_str",    [&]{ if( *std::to_string(value).c_str() == 43 ) printf("%s\n",hint); }),
      func("konvert",   [&]{ if( konvert::itoa(value, cstr) == 43     ) printf("%s\n",hint); })
    );

    { std::cout << "konvert   : " << konvert::itoa(value, cstr) << " = \"" << cstr << "\"\n"
                << "sprintf   : " << sprintf(str, "%d", value)  << " = \"" << str  << "\"\n"
                << "to_string : \"" << std::to_string(value) << "\"\n"; }
  }


  /**
   * Benchmark konvert::atoi vs system alternatives
   * - atoi
   * - sscanf("%d")
   */

  const char *str_ints =
    "42            -1            666666666666  -666          -23489535     "
    "0             1028455535    -502345535    202345535     1232348935    "
    "450234535     9999999999999 026026        4             502348965     ";

  unsigned long separation = 14;
  auto pos = str_ints;


  for(auto t=0; t<15; t++) {

    time_compare(
      1000000u, "string -> int: " +  std::string(pos,separation),

      func("konvert",   [&]{ if( konvert::atoi(pos) == 43 )       printf("%s\n",hint); }),
      func("atoi",      [&]{ if( atoi(pos) == 43 )                printf("%s\n",hint); }),
      func("strtol",    [&]{ if( strtol(pos, nullptr,10) == 43 )  printf("%s\n",hint); }),
      func("scanf",     [&]{
        int scanfint; sscanf(pos,"%d",&scanfint);
        if( scanfint == 43 ) printf("%s\n",hint); })
    );

    { int scanfres; sscanf(pos, "%d", &scanfres);
      std::cout << "konvert   : " << konvert::atoi(pos)      << std::endl
                << "konvert_l : " << konvert::atol(pos)      << std::endl
                << "atoi      : " << atoi(pos)               << std::endl
                << "strtol    : " << strtol(pos, nullptr,10) << std::endl
                << "sscanf    : " << scanfres                << std::endl; }

    pos += separation;
  }


  /**
   * Benchmark konvert::atof vs system alternatives
   * - atof
   * - sscanf("%lf")
   */

  const char *str_doubles =
    "42.4242       -1.           -66666.666666 42            -2348953.3345 "
    "59489.5535    10.28455535   -5023.45535   20.2345535    12323489.3343 "
    "45023.4535    99.9999999999 026026.000056 40.           50234896.3345 ";

  pos = str_doubles;
  for(auto t=0; t<15; t++){

    time_compare(
      1000000u, "string -> double: " + std::string(pos,separation),

      func("konvert", [&]{ if( konvert::atof(pos) == 43.0 )   printf("%s\n",hint); }),
      func("atof",    [&]{ if( atof(pos) == 43.0 )            printf("%s\n",hint); }),
      func("strtod",  [&]{ if( strtod(pos, nullptr) == 43.0 ) printf("%s\n",hint); }),
      func("scanf",   [&]{
        double scanfd; sscanf(pos,"%lf",&scanfd);
        if( scanfd == 43.0 ) printf("%s\n",hint); })
    );


    { double scanfd; sscanf(pos, "%lf", &scanfd);
      std::cout << std::setprecision(16)
                << "konvert : " << konvert::atof(pos)   << std::endl
                << "atof    : " << atof(pos)            << std::endl
                << "strtod  : " << strtod(pos, nullptr) << std::endl
                << "sscanf  : " << scanfd               << std::endl; }

    pos += separation;
  }
}